

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_MinPlayers.cpp
# Opt level: O0

void __thiscall
RenX_MinPlayersPlugin::AnyDeath(RenX_MinPlayersPlugin *this,Server *server,PlayerInfo *player)

{
  bool bVar1;
  size_type sVar2;
  pointer pPVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  size_t local_70;
  char *local_68;
  size_t local_60;
  char *local_58;
  size_t local_50;
  char *local_48;
  _Self local_40;
  _Self local_38;
  iterator node;
  size_t nod_count;
  size_t gdi_count;
  PlayerInfo *player_local;
  Server *server_local;
  RenX_MinPlayersPlugin *this_local;
  
  if (((this->phase_bots != 0) && ((player->isBot & 1U) != 0)) &&
     (sVar2 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                        ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                         (server + 0x10)), sVar2 != 0)) {
    nod_count = 0;
    node._M_node = (_List_node_base *)0x0;
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                   ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)(server + 0x10));
    while( true ) {
      local_40._M_node =
           (_List_node_base *)
           std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                     ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)(server + 0x10));
      bVar1 = std::operator==(&local_38,&local_40);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pPVar3 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_38);
      if (pPVar3->team == GDI) {
        nod_count = nod_count + 1;
      }
      else if (pPVar3->team == Nod) {
        node._M_node = (_List_node_base *)((long)&(node._M_node)->_M_next + 1);
      }
      std::_List_iterator<RenX::PlayerInfo>::operator++(&local_38);
    }
    if (node._M_node < nod_count) {
      if (player->team != Nod) {
        bVar4 = sv("Bot Phasing",0xb);
        local_50 = bVar4._M_len;
        local_48 = bVar4._M_str;
        RenX::Server::kickPlayer(server,player,local_50,local_48);
        this->phase_bots = this->phase_bots - 1;
      }
    }
    else if (nod_count < node._M_node) {
      if (player->team != GDI) {
        bVar4 = sv("Bot Phasing",0xb);
        local_60 = bVar4._M_len;
        local_58 = bVar4._M_str;
        RenX::Server::kickPlayer(server,player,local_60,local_58);
        this->phase_bots = this->phase_bots - 1;
      }
    }
    else {
      bVar4 = sv("Bot Phasing",0xb);
      local_70 = bVar4._M_len;
      local_68 = bVar4._M_str;
      RenX::Server::kickPlayer(server,player,local_70,local_68);
      this->phase_bots = this->phase_bots - 1;
    }
  }
  return;
}

Assistant:

void RenX_MinPlayersPlugin::AnyDeath(RenX::Server &server, const RenX::PlayerInfo &player) {
	if (RenX_MinPlayersPlugin::phase_bots != 0 && player.isBot && server.players.size() != 0) {
		size_t gdi_count = 0, nod_count = 0;
		for (auto node = server.players.begin(); node != server.players.end(); ++node) {
			switch (node->team) {
			case RenX::TeamType::GDI:
				++gdi_count;
				break;
			case RenX::TeamType::Nod:
				++nod_count;
				break;
			default:
				break;
			}
		}

		if (gdi_count > nod_count) {
			if (player.team != RenX::TeamType::Nod) {
				server.kickPlayer(player, "Bot Phasing"sv);
				--RenX_MinPlayersPlugin::phase_bots;
			}
		}
		else if (nod_count > gdi_count) {
			if (player.team != RenX::TeamType::GDI) {
				server.kickPlayer(player, "Bot Phasing"sv);
				--RenX_MinPlayersPlugin::phase_bots;
			}
		}
		else {
			server.kickPlayer(player, "Bot Phasing"sv);
			--RenX_MinPlayersPlugin::phase_bots;
		}
	}
}